

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump.c
# Opt level: O3

void main_cold_17(void)

{
  FILE *__stream;
  undefined4 *puVar1;
  undefined8 uVar2;
  
  __stream = _stderr;
  puVar1 = (undefined4 *)coda_get_errno();
  uVar2 = coda_errno_to_string(*puVar1);
  fprintf(__stream,"ERROR: %s\n",uVar2);
  exit(1);
}

Assistant:

static void handle_ascii_run_mode(int argc, char *argv[])
{
    int use_special_types;
    int perform_conversions;
    int i;

    traverse_info.file_name = NULL;
    traverse_info.filter[0] = NULL;
    output_file_name = NULL;
    ascii_col_sep = " ";
    ascii_output = stdout;
    verbosity = 1;
    calc_dim = 1;
    use_special_types = 1;
    perform_conversions = 1;
    show_index = 0;
    show_label = 0;
    show_quotes = 0;
    show_time_as_string = 0;

    for (i = 0; i < argc; i++)
    {
        if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if ((strcmp(argv[i], "-f") == 0 || strcmp(argv[i], "--filter") == 0) &&
                 i + 1 < argc && argv[i + 1][0] != '-')
        {
            traverse_info.filter[0] = codadump_filter_create(argv[i + 1]);
            if (traverse_info.filter[0] == NULL)
            {
                fprintf(stderr, "ERROR: incorrect filter or empty filter\n");
                print_help();
                exit(1);
            }
            i++;
        }
        else if (strcmp(argv[i], "-i") == 0 || strcmp(argv[i], "--index") == 0)
        {
            show_index = 1;
        }
        else if (strcmp(argv[i], "-l") == 0 || strcmp(argv[i], "--label") == 0)
        {
            show_label = 1;
        }
        else if ((strcmp(argv[i], "-o") == 0 || strcmp(argv[i], "--output") == 0) &&
                 i + 1 < argc && argv[i + 1][0] != '-')
        {
            output_file_name = argv[i + 1];
            i++;
        }
        else if (strcmp(argv[i], "-q") == 0 || strcmp(argv[i], "--quote_strings") == 0)
        {
            show_quotes = 1;
        }
        else if ((strcmp(argv[i], "-s") == 0 || strcmp(argv[i], "--column_separator") == 0) &&
                 i + 1 < argc && argv[i + 1][0] != '-')
        {
            ascii_col_sep = argv[i + 1];
            i++;
        }
        else if (strcmp(argv[i], "-t") == 0 || strcmp(argv[i], "--time_as_string") == 0)
        {
            show_time_as_string = 1;
        }
        else if (strcmp(argv[i], "--no_special_types") == 0)
        {
            use_special_types = 0;
        }
        else if (i == argc - 1 && argv[i][0] != '-')
        {
            traverse_info.file_name = argv[i];
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
    }

    if (traverse_info.file_name == NULL || traverse_info.file_name[0] == '\0')
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }
    coda_set_option_bypass_special_types(!use_special_types);
    coda_set_option_perform_boundary_checks(0);
    coda_set_option_perform_conversions(perform_conversions);
    traverse_info_init();
    dim_info_init();
    if (output_file_name != NULL)
    {
        ascii_output = fopen(output_file_name, "w");
        if (ascii_output == NULL)
        {
            fprintf(stderr, "ERROR: could not create output file \"%s\"\n", output_file_name);
            exit(1);
        }
    }

    traverse_product();

    if (output_file_name != NULL)
    {
        fclose(ascii_output);
    }
    dim_info_done();
    traverse_info_done();
    coda_done();
}